

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmeander.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  long in_RSI;
  int in_EDI;
  int j;
  int i;
  int iPhase;
  int iPeriod;
  int iHalfPeriod;
  int nLength;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  if ((in_EDI == 3) || (in_EDI == 4)) {
    iVar1 = atoi(*(char **)(in_RSI + 8));
    if (iVar1 < 1) {
      fprintf(_stderr,"Length must be positive\n");
      local_4 = 1;
    }
    else {
      iVar2 = atoi(*(char **)(in_RSI + 0x10));
      if (iVar2 < 1) {
        fprintf(_stderr,"Half of period must be positive\n");
        local_4 = 1;
      }
      else {
        if (in_EDI == 4) {
          local_2c = atoi(*(char **)(in_RSI + 0x18));
        }
        else {
          local_2c = 0;
        }
        local_28 = local_2c % (iVar2 << 1);
        local_24 = 0;
        while (local_24 < iVar1) {
          if (local_28 < iVar2) {
            printf("1\n");
LAB_001012da:
            local_28 = local_28 + 1;
            local_24 = local_24 + 1;
          }
          else {
            if (local_28 < iVar2 << 1) {
              printf("-1\n");
              goto LAB_001012da;
            }
            local_28 = 0;
          }
        }
        local_4 = 0;
      }
    }
  }
  else {
    fprintf(_stderr,"Usage: dmeander Length HalfPeriod [PhaseShift]\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main (int argc, char* argv[])
{
    if(3 != argc && 4 != argc) {
	fprintf(stderr, "Usage: dmeander Length HalfPeriod [PhaseShift]\n");
	return 1;
    }

    int	nLength = atoi(argv[1]);
    if(nLength <= 0) {
	fprintf(stderr, "Length must be positive\n");
	return 1;
    }
    int	iHalfPeriod = atoi(argv[2]);
    if(iHalfPeriod <= 0) {
	fprintf(stderr, "Half of period must be positive\n");
	return 1;
    }
    int	iPeriod = 2 * iHalfPeriod;
    int iPhase = (4 == argc)? atoi(argv[3]): 0;

    int	i, j = iPhase % iPeriod;
    for(i = 0; i < nLength; ) {
	if(j < iHalfPeriod) {
	    printf("1\n");
	    ++j;
	} else if(j < iPeriod) {
	    printf("-1\n");
	    ++j;
	} else {
	    j = 0;
	    continue;
	}
	++i;
    }
    return 0;
}